

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::SetDragDropPayload(char *type,void *data,size_t data_size,ImGuiCond cond)

{
  ImGuiContext *pIVar1;
  size_t sVar2;
  int in_ECX;
  ulong in_RDX;
  void *in_RSI;
  char *in_RDI;
  undefined1 uVar3;
  bool bVar4;
  ImGuiPayload *payload;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffc8;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffffcd;
  undefined1 uVar6;
  ImVector<unsigned_char> *this;
  int local_1c;
  
  pIVar1 = GImGui;
  this = (ImVector<unsigned_char> *)&GImGui->DragDropPayload;
  local_1c = in_ECX;
  if (in_ECX == 0) {
    local_1c = 1;
  }
  if (in_RDI == (char *)0x0) {
    __assert_fail("type != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x2618,
                  "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
  }
  sVar2 = strlen(in_RDI);
  uVar3 = sVar2 < 0x21;
  if (!(bool)uVar3) {
    __assert_fail("strlen(type) < ((int)(sizeof(payload.DataType) / sizeof(*(payload.DataType)))) && \"Payload type can be at most 32 characters long\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x2619,
                  "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
  }
  if ((in_RSI == (void *)0x0) || (uVar6 = true, in_RDX == 0)) {
    in_stack_ffffffffffffffcd = in_RSI == (void *)0x0 && in_RDX == 0;
    uVar6 = in_stack_ffffffffffffffcd;
  }
  if ((bool)uVar6 != false) {
    uVar5 = local_1c == 1 || local_1c == 2;
    if (local_1c != 1 && local_1c != 2) {
      __assert_fail("cond == ImGuiCond_Always || cond == ImGuiCond_Once",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x261b,
                    "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)")
      ;
    }
    if (*(ImGuiID *)((long)&this->Data + 4) == 0) {
      __assert_fail("payload.SourceId != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x261c,
                    "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)")
      ;
    }
    if ((local_1c == 1) || (this[1].Capacity == -1)) {
      ImStrncpy((char *)this,
                (char *)CONCAT17(uVar3,CONCAT16(uVar6,CONCAT15(in_stack_ffffffffffffffcd,
                                                               CONCAT14(uVar5,
                                                  in_stack_ffffffffffffffc8)))),0x1cd84c);
      ImVector<unsigned_char>::resize
                (this,CONCAT13(uVar3,CONCAT12(uVar6,CONCAT11(in_stack_ffffffffffffffcd,uVar5))));
      if (in_RDX < 0x11) {
        if (in_RDX == 0) {
          this->Size = 0;
          this->Capacity = 0;
        }
        else {
          memset(pIVar1->DragDropPayloadBufLocal,0,0x10);
          *(uchar **)this = pIVar1->DragDropPayloadBufLocal;
          memcpy(*(void **)this,in_RSI,in_RDX);
        }
      }
      else {
        ImVector<unsigned_char>::resize
                  (this,CONCAT13(uVar3,CONCAT12(uVar6,CONCAT11(in_stack_ffffffffffffffcd,uVar5))));
        *(uchar **)this = (pIVar1->DragDropPayloadBufHeap).Data;
        memcpy(*(void **)this,in_RSI,in_RDX);
      }
      *(int *)&this->Data = (int)in_RDX;
    }
    this[1].Capacity = pIVar1->FrameCount;
    bVar4 = true;
    if (pIVar1->DragDropAcceptFrameCount != pIVar1->FrameCount) {
      bVar4 = pIVar1->DragDropAcceptFrameCount == pIVar1->FrameCount + -1;
    }
    return bVar4;
  }
  __assert_fail("(data != __null && data_size > 0) || (data == __null && data_size == 0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0x261a,
                "bool ImGui::SetDragDropPayload(const char *, const void *, size_t, ImGuiCond)");
}

Assistant:

bool ImGui::SetDragDropPayload(const char* type, const void* data, size_t data_size, ImGuiCond cond)
{
    ImGuiContext& g = *GImGui;
    ImGuiPayload& payload = g.DragDropPayload;
    if (cond == 0)
        cond = ImGuiCond_Always;

    IM_ASSERT(type != NULL);
    IM_ASSERT(strlen(type) < IM_ARRAYSIZE(payload.DataType) && "Payload type can be at most 32 characters long");
    IM_ASSERT((data != NULL && data_size > 0) || (data == NULL && data_size == 0));
    IM_ASSERT(cond == ImGuiCond_Always || cond == ImGuiCond_Once);
    IM_ASSERT(payload.SourceId != 0);                               // Not called between BeginDragDropSource() and EndDragDropSource()

    if (cond == ImGuiCond_Always || payload.DataFrameCount == -1)
    {
        // Copy payload
        ImStrncpy(payload.DataType, type, IM_ARRAYSIZE(payload.DataType));
        g.DragDropPayloadBufHeap.resize(0);
        if (data_size > sizeof(g.DragDropPayloadBufLocal))
        {
            // Store in heap
            g.DragDropPayloadBufHeap.resize((int)data_size);
            payload.Data = g.DragDropPayloadBufHeap.Data;
            memcpy(payload.Data, data, data_size);
        }
        else if (data_size > 0)
        {
            // Store locally
            memset(&g.DragDropPayloadBufLocal, 0, sizeof(g.DragDropPayloadBufLocal));
            payload.Data = g.DragDropPayloadBufLocal;
            memcpy(payload.Data, data, data_size);
        }
        else
        {
            payload.Data = NULL;
        }
        payload.DataSize = (int)data_size;
    }
    payload.DataFrameCount = g.FrameCount;

    return (g.DragDropAcceptFrameCount == g.FrameCount) || (g.DragDropAcceptFrameCount == g.FrameCount - 1);
}